

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

void __thiscall absl::Cord::RemoveSuffix(Cord *this,size_t n)

{
  RefcountAndFlags *pRVar1;
  uint uVar2;
  byte bVar3;
  uint8_t uVar4;
  ulong uVar5;
  size_t x;
  ulong uVar6;
  CordRepBtree *pCVar7;
  AlphaNum *in_R9;
  CordRepBtree *pCVar8;
  CordRepBtree *tree;
  CordzInfo *unaff_R15;
  string death_message;
  CordRep *local_138;
  CordRepBtree *local_130;
  char *local_128;
  string local_100;
  string local_e0 [32];
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  bVar3 = (this->contents_).data_.rep_.field_0.data[0];
  uVar5 = (ulong)(char)bVar3;
  if ((uVar5 & 1) == 0) {
    uVar6 = uVar5 >> 1;
  }
  else {
    uVar6 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (uVar6 < n) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_e0,"Check n <= size() failed: ",(allocator<char> *)&local_130);
    local_130 = (CordRepBtree *)0x16;
    local_128 = "Requested suffix size ";
    AlphaNum::AlphaNum(&local_60,n);
    local_90.piece_._M_len = 0x15;
    local_90.piece_._M_str = " exceeds Cord\'s size ";
    x = size(this);
    AlphaNum::AlphaNum(&local_c0,x);
    StrCat_abi_cxx11_(&local_100,(absl *)&local_130,&local_60,&local_90,&local_c0,in_R9);
    std::__cxx11::string::operator+=(local_e0,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
              (3,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
               ,0x2c5,local_e0);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
                  ,0x2c5,"void absl::Cord::RemoveSuffix(size_t)");
  }
  tree = (CordRepBtree *)(this->contents_).data_.rep_.field_0.as_tree.rep;
  if ((tree == (CordRepBtree *)0x0 || (bVar3 & 1) == 0) || ((tree->super_CordRep).length != 0)) {
    if (tree != (CordRepBtree *)0x0 && (uVar5 & 1) != 0) {
      unaff_R15 = cord_internal::InlineData::cordz_info((InlineData *)this);
      if (unaff_R15 != (CordzInfo *)0x0) {
        cord_internal::CordzInfo::Lock(unaff_R15,kRemoveSuffix);
      }
      if ((tree->super_CordRep).tag == '\x02') {
        RemoveSuffix();
        tree = local_130;
      }
      uVar5 = (tree->super_CordRep).length;
      if (n < uVar5) {
        uVar4 = (tree->super_CordRep).tag;
        pCVar8 = tree;
        if (uVar4 == '\x05') {
LAB_0013123c:
          if (uVar5 - n == 0) {
            __assert_fail("n != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                          ,0x1a3,
                          "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                         );
          }
          if (uVar5 == 0) {
            __assert_fail("pos < rep->length",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                          ,0x1a4,
                          "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                         );
          }
          if (uVar5 < n) {
            __assert_fail("n <= rep->length - pos",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                          ,0x1a5,
                          "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                         );
          }
          if (n == 0) {
            LOCK();
            pRVar1 = &(tree->super_CordRep).refcount;
            (pRVar1->count_).super___atomic_base<int>._M_i =
                 (pRVar1->count_).super___atomic_base<int>._M_i + 2;
            UNLOCK();
          }
          else {
            if ((tree->super_CordRep).tag == '\x01') {
              local_138 = tree->edges_[0];
              pCVar7 = (CordRepBtree *)tree->edges_[1];
            }
            else {
              local_138 = (CordRep *)0x0;
              pCVar7 = tree;
            }
            pCVar8 = (CordRepBtree *)operator_new(0x20);
            (pCVar8->super_CordRep).length = 0;
            (pCVar8->super_CordRep).refcount = (atomic<int>)0x0;
            (pCVar8->super_CordRep).tag = '\0';
            (pCVar8->super_CordRep).storage[0] = '\0';
            (pCVar8->super_CordRep).storage[1] = '\0';
            (pCVar8->super_CordRep).storage[2] = '\0';
            (pCVar8->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
            (pCVar8->super_CordRep).length = uVar5 - n;
            (pCVar8->super_CordRep).tag = '\x01';
            pCVar8->edges_[0] = local_138;
            if (pCVar7 == (CordRepBtree *)0x0) {
              __assert_fail("rep != nullptr",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                            ,0x371,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
            }
            LOCK();
            pRVar1 = &(pCVar7->super_CordRep).refcount;
            (pRVar1->count_).super___atomic_base<int>._M_i =
                 (pRVar1->count_).super___atomic_base<int>._M_i + 2;
            UNLOCK();
            pCVar8->edges_[1] = &pCVar7->super_CordRep;
          }
          LOCK();
          pRVar1 = &(tree->super_CordRep).refcount;
          uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
          (pRVar1->count_).super___atomic_base<int>._M_i =
               (pRVar1->count_).super___atomic_base<int>._M_i + -2;
          UNLOCK();
          if ((uVar2 & 1) == 0 && (int)uVar2 < 1) {
LAB_001314f5:
            __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                          ,0xaa,
                          "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()"
                         );
          }
          if (uVar2 == 2) {
            cord_internal::CordRep::Destroy(&tree->super_CordRep);
          }
        }
        else if (uVar4 == '\x03') {
          pCVar8 = (CordRepBtree *)cord_internal::CordRepBtree::RemoveSuffix(tree,n);
        }
        else {
          if ((tree->super_CordRep).refcount.count_.super___atomic_base<int>._M_i != 2) {
            uVar5 = (tree->super_CordRep).length;
            goto LAB_0013123c;
          }
          bVar3 = (tree->super_CordRep).tag;
          if (bVar3 != 1 && bVar3 < 6) {
            __assert_fail("tree->IsFlat() || tree->IsSubstring()",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
                          ,0x2d4,"void absl::Cord::RemoveSuffix(size_t)");
          }
          (tree->super_CordRep).length = (tree->super_CordRep).length - n;
        }
      }
      else {
        LOCK();
        pRVar1 = &(tree->super_CordRep).refcount;
        uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
        (pRVar1->count_).super___atomic_base<int>._M_i =
             (pRVar1->count_).super___atomic_base<int>._M_i + -2;
        UNLOCK();
        if ((uVar2 & 1) == 0 && (int)uVar2 < 1) goto LAB_001314f5;
        if (uVar2 == 2) {
          cord_internal::CordRep::Destroy(&tree->super_CordRep);
        }
        pCVar8 = (CordRepBtree *)0x0;
      }
      if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
        __assert_fail("data_.is_tree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.h"
                      ,0x4e7,
                      "void absl::Cord::InlineRep::SetTreeOrEmpty(absl::Nullable<CordRep *>, const CordzUpdateScope &)"
                     );
      }
      if (pCVar8 == (CordRepBtree *)0x0) {
        (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
        (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
      }
      else {
        (this->contents_).data_.rep_.field_0.as_tree.rep = &pCVar8->super_CordRep;
      }
      if (unaff_R15 == (CordzInfo *)0x0) {
        return;
      }
      goto LAB_00131455;
    }
    if ((bVar3 & 1) != 0) {
      RemoveSuffix();
      goto LAB_0013140b;
    }
    if (0x1f < bVar3) {
      __assert_fail("tag <= kMaxInline",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
                    ,0xb9,"void absl::Cord::InlineRep::reduce_size(size_t)");
    }
    uVar5 = (ulong)(bVar3 >> 1);
  }
  else {
LAB_0013140b:
    RemoveSuffix();
    uVar5 = 0;
  }
  pCVar8 = (CordRepBtree *)(uVar5 - n);
  if (uVar5 < n) {
    __assert_fail("tag >= n",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
                  ,0xba,"void absl::Cord::InlineRep::reduce_size(size_t)");
  }
  memset((void *)((long)this + (long)pCVar8 + 1),0,n);
  if (pCVar8 < (CordRepBtree *)0x10) {
    (this->contents_).data_.rep_.field_0.data[0] = (char)pCVar8 * '\x02';
    return;
  }
  RemoveSuffix();
LAB_00131455:
  Mutex::AssertHeld(&unaff_R15->mutex_);
  unaff_R15->rep_ = &pCVar8->super_CordRep;
  cord_internal::CordzInfo::Unlock(unaff_R15);
  return;
}

Assistant:

void Cord::RemoveSuffix(size_t n) {
  ABSL_INTERNAL_CHECK(n <= size(),
                      absl::StrCat("Requested suffix size ", n,
                                   " exceeds Cord's size ", size()));
  contents_.MaybeRemoveEmptyCrcNode();
  CordRep* tree = contents_.tree();
  if (tree == nullptr) {
    contents_.reduce_size(n);
  } else {
    auto constexpr method = CordzUpdateTracker::kRemoveSuffix;
    CordzUpdateScope scope(contents_.cordz_info(), method);
    tree = cord_internal::RemoveCrcNode(tree);
    if (n >= tree->length) {
      CordRep::Unref(tree);
      tree = nullptr;
    } else if (tree->IsBtree()) {
      tree = CordRepBtree::RemoveSuffix(tree->btree(), n);
    } else if (!tree->IsExternal() && tree->refcount.IsOne()) {
      assert(tree->IsFlat() || tree->IsSubstring());
      tree->length -= n;
    } else {
      CordRep* rep = CordRepSubstring::Substring(tree, 0, tree->length - n);
      CordRep::Unref(tree);
      tree = rep;
    }
    contents_.SetTreeOrEmpty(tree, scope);
  }
}